

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SkipList *memTable)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  uint64_t *key;
  void *in_RCX;
  uint32_t seed;
  uint hash [4];
  ConstIterator i;
  
  memset(this,0,0x2800);
  i = SkipList::constBegin(memTable);
  while( true ) {
    bVar3 = SkipList::ConstIterator::hasNext(&i);
    if (!bVar3) break;
    SkipList::ConstIterator::next(&i);
    hash[0] = 0;
    hash[1] = 0;
    hash[2] = 0;
    hash[3] = 0;
    key = SkipList::ConstIterator::key(&i);
    MurmurHash3_x64_128(key,(int)hash,seed,in_RCX);
    uVar2 = (hash._0_8_ & 0xffffffff) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar2 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    uVar2 = ((ulong)hash._0_8_ >> 0x20) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar2 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    uVar2 = (hash._8_8_ & 0xffffffff) % 0x14000;
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)(uVar2 >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    in_RCX = (void *)(((ulong)hash._8_8_ >> 0x20) % 0x14000);
    puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)((uint)((ulong)in_RCX >> 3) & 0x3ff8));
    *puVar1 = *puVar1 | 1L << ((byte)in_RCX & 0x3f);
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SkipList &memTable) {
  auto i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&i.key(), sizeof(i.key()), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}